

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.cc
# Opt level: O2

LRUHandle * __thiscall
leveldb::anon_unknown_0::HandleTable::Remove(HandleTable *this,Slice *key,uint32_t hash)

{
  long lVar1;
  LRUHandle *pLVar2;
  LRUHandle **ppLVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ppLVar3 = FindPointer(this,key,hash);
  pLVar2 = *ppLVar3;
  if (pLVar2 != (LRUHandle *)0x0) {
    *ppLVar3 = pLVar2->next_hash;
    this->elems_ = this->elems_ - 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pLVar2;
  }
  __stack_chk_fail();
}

Assistant:

LRUHandle* Remove(const Slice& key, uint32_t hash) {
    LRUHandle** ptr = FindPointer(key, hash);
    LRUHandle* result = *ptr;
    if (result != nullptr) {
      *ptr = result->next_hash;
      --elems_;
    }
    return result;
  }